

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jedi.cpp
# Opt level: O1

int drawDisplayStringList(void)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int y;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  char *c;
  
  drawMap();
  iVar3 = display_string_list_line_count;
  iVar4 = display_string_list_line_count * 6;
  y = display_string_list_line_count * -6 + 0x40 >> 1;
  iVar2 = display_string_list_line_count * 6;
  pcVar6 = prname::tbuf + (long)y * 0x80 + 0x303;
  lVar8 = 0;
  do {
    if (-1 < iVar3) {
      lVar9 = 0;
      do {
        pcVar6[lVar9] = -1;
        lVar9 = lVar9 + 0x80;
      } while (((ulong)(iVar2 + 4) + 1) * 0x80 != lVar9);
    }
    lVar8 = lVar8 + 1;
    pcVar6 = pcVar6 + 1;
  } while (lVar8 != 0x7c);
  pcVar6 = prname::tbuf + (long)y * 0x80 + 900;
  lVar8 = 0;
  do {
    pcVar5 = pcVar6;
    uVar7 = (ulong)(iVar4 + 2);
    if (-1 < iVar3) {
      do {
        *pcVar5 = '\0';
        pcVar5 = pcVar5 + 0x80;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
    lVar8 = lVar8 + 1;
    pcVar6 = pcVar6 + 1;
  } while (lVar8 != 0x7a);
  pcVar6 = display_string_list_buffer;
  iVar4 = 5;
  do {
    cVar1 = *pcVar6;
    if (cVar1 == '\n') {
      y = y + 6;
      iVar4 = 5;
    }
    else {
      if (cVar1 == '\0') {
        return y;
      }
      drawChar(iVar4,y,(int)cVar1);
      iVar4 = iVar4 + 4;
    }
    pcVar6 = pcVar6 + 1;
  } while( true );
}

Assistant:

static int drawDisplayStringList()
{
    drawMap();
    int w = 30 * 4;
    int x = 5;
    int sx = x;
    int y = (DISPLAY_HEIGHT-display_string_list_line_count*6) / 2;
    fillBox(x - 2, y - 2, w + 4, display_string_list_line_count * 6 + 5, 255);
    fillBox(x - 1, y - 1, w + 2, display_string_list_line_count * 6 + 2, 0);
    for(char* c=display_string_list_buffer; *c; c++)
    {
        if (*c == '\n')
        {
            x = sx;
            y += 6;
        }else{
            drawChar(x, y, *c);
            x+=4;
        }
    }
    return y;
}